

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xform.cc
# Opt level: O3

matrix2d * tinyusdz::transpose(matrix2d *_m)

{
  double dVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  matrix2d *in_RDI;
  
  dVar1 = _m->m[1][1];
  in_RDI->m[0][0] = _m->m[0][0];
  auVar2 = *(undefined1 (*) [16])(_m->m[0] + 1);
  auVar3._8_4_ = auVar2._0_4_;
  auVar3._0_8_ = auVar2._8_8_;
  auVar3._12_4_ = auVar2._4_4_;
  *(undefined1 (*) [16])(in_RDI->m[0] + 1) = auVar3;
  in_RDI->m[1][1] = dVar1;
  return in_RDI;
}

Assistant:

value::matrix2d transpose(const value::matrix2d &_m) {
  matrix22d m;
  matrix22d tm;
  // memory layout is same
  memcpy(&m[0][0], _m.m, sizeof(double) * 2 * 2);
  tm = linalg::transpose(m);

  value::matrix2d dst;

  // memory layout is same
  memcpy(&dst.m[0][0], &tm[0][0], sizeof(double) * 2 * 2);

  return dst;
}